

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

void __thiscall r_exec::Group::inject_group(Group *this,View *view)

{
  atomic_int_fast64_t *paVar1;
  View *pVVar2;
  _Object *p_Var3;
  Group *this_00;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Mem *this_01;
  UpdateJob *this_02;
  uint64_t uVar8;
  float fVar9;
  float fVar10;
  Group *local_38;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar5 == 0) {
    local_38 = (Group *)r_exec::View::get_oid(view);
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->group_views,(key_type *)&local_38);
    pVVar2 = (View *)pmVar6->object;
    if (pVVar2 != view) {
      if (pVVar2 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar2->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar2->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar2->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar6->object = (_Object *)view;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,5);
    fVar9 = (float)r_code::Atom::asFloat();
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,6);
    fVar10 = (float)r_code::Atom::asFloat();
    if (fVar10 < fVar9) {
      fVar9 = r_exec::View::get_sln(view);
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,2);
      fVar10 = (float)r_code::Atom::asFloat();
      if (fVar10 < fVar9) {
        fVar9 = r_exec::View::get_vis(view);
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,4);
        fVar10 = (float)r_code::Atom::asFloat();
        if (fVar10 < fVar9) {
          bVar4 = r_exec::View::get_cov(view);
          local_38 = this;
          pmVar7 = std::__detail::
                   _Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)((view->super_View).object.object + 0x3b),&local_38);
          *pmVar7 = bVar4;
        }
        inject_reduction_jobs(this,view);
      }
    }
    p_Var3 = (view->super_View).object.object;
    (*p_Var3->_vptr__Object[5])(p_Var3,1);
    fVar9 = (float)r_code::Atom::asFloat();
    if ((int)(long)fVar9 != 0) {
      this_01 = (_Mem *)r_code::Mem::Get();
      this_02 = (UpdateJob *)operator_new(0x28);
      this_00 = (Group *)(view->super_View).object.object;
      uVar8 = (*Now)();
      uVar8 = get_next_upr_time(this_00,uVar8);
      UpdateJob::UpdateJob(this_02,this_00,uVar8);
      _Mem::pushTimeJob(this_01,(TimeJob *)this_02);
    }
    notifyNew(this,view);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

void Group::inject_group(View *view)
{
    std::lock_guard<std::mutex> guard(mutex);
    group_views[view->get_oid()] = view;

    if (get_c_sln() > get_c_sln_thr() && view->get_sln() > get_sln_thr()) { // group is c-salient and view is salient.
        if (view->get_vis() > get_vis_thr()) { // new visible group in a c-active and c-salient host.
            ((Group *)view->object)->viewing_groups[this] = view->get_cov();
        }

        inject_reduction_jobs(view);
    }

    if (((Group *)view->object)->get_upr() > 0) { // inject the next update job for the group.
        _Mem::Get()->pushTimeJob(new UpdateJob((Group *)view->object, ((Group *)view->object)->get_next_upr_time(Now())));
    }

    notifyNew(view);
}